

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# action.h
# Opt level: O2

void __thiscall re2c::Action::clear(Action *this)

{
  if (this->type == INITIAL) {
    operator_delete((this->info).initial,8);
    return;
  }
  return;
}

Assistant:

void clear ()
	{
		switch (type)
		{
			case INITIAL:
				delete info.initial;
				break;
			case MATCH:
			case SAVE:
			case MOVE:
			case ACCEPT:
			case RULE:
				break;
		}
	}